

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockTime.h
# Opt level: O2

void __thiscall
DIS::StopFreezeReliablePdu::setRealWorldTime(StopFreezeReliablePdu *this,ClockTime *pX)

{
  uint uVar1;
  
  uVar1 = pX->_timePastHour;
  (this->_realWorldTime)._hour = pX->_hour;
  (this->_realWorldTime)._timePastHour = uVar1;
  return;
}

Assistant:

class OPENDIS7_EXPORT ClockTime
{
protected:
  /** Hours in UTC */
  unsigned int _hour; 

  /** Time past the hour */
  unsigned int _timePastHour; 


 public:
    ClockTime();
    virtual ~ClockTime();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned int getHour() const; 
    void setHour(unsigned int pX); 

    unsigned int getTimePastHour() const; 
    void setTimePastHour(unsigned int pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const ClockTime& rhs) const;
}